

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

BadNameString * CLI::BadNameString::BadPositionalName(string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000018;
  BadNameString *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = in_RDI;
  ::std::operator+((char *)in_RDI,in_RSI);
  BadNameString(in_stack_00000020,in_stack_00000018);
  ::std::__cxx11::string::~string(this);
  return (BadNameString *)in_RDI;
}

Assistant:

static BadNameString BadPositionalName(std::string name) {
        return BadNameString("Invalid positional Name: " + name);
    }